

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall Units_unitAttributes_Test::TestBody(Units_unitAttributes_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *psVar3;
  char cVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  double multiplier;
  double exponent;
  string reference;
  UnitsPtr u;
  string prefix;
  string id;
  ModelPtr m;
  long *local_120;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  long local_110 [2];
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  double local_c0;
  double local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  shared_ptr *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  libcellml::Model::create();
  libcellml::Units::create();
  psVar3 = local_90;
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"fahrenheitish","");
  libcellml::NamedEntity::setName(psVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  psVar3 = local_90;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"kelvin","");
  paVar2 = &local_80.field_2;
  pcVar5 = "";
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"","");
  libcellml::Units::addUnit(psVar3,(int)&local_b0,1.0,1.8,(string *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  libcellml::Model::addUnits(local_40);
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_60 = &local_50;
  local_58 = 0;
  local_50 = 0;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  local_80._M_dataplus._M_p = (pointer)paVar2;
  libcellml::Units::unitAttributes
            ((ulong)local_90,(string *)0x0,(string *)&local_b0,(double *)&local_80,&local_b8,
             (string *)&local_c0);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_120,"\"kelvin\"","reference",(char (*) [7])"kelvin",&local_b0);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2ef,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar5 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_120,"\"\"","prefix",(char (*) [1])0x15db90,&local_80);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_120,"1.0","exponent",1.0,local_b8);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_120,"1.8","multiplier",1.8,local_c0);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar3 = local_90;
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"NewUnit","");
  pcVar5 = "";
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"","");
  libcellml::Units::addUnit(psVar3,(int)&local_120,1.05,17.0,(string *)&DAT_00000004);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  libcellml::Units::unitAttributes
            ((ulong)local_90,(string *)0x1,(string *)&local_b0,(double *)&local_80,&local_b8,
             (string *)&local_c0);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&local_120,"\"NewUnit\"","reference",(char (*) [8])"NewUnit",&local_b0);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&local_120,"\"4\"","prefix",(char (*) [2])0x15dbb9,&local_80);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_120,"1.05","exponent",1.05,local_b8);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_120,"17","multiplier",17.0,local_c0);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Units::unitAttributes
            ((ulong)local_90,(string *)0x2,(string *)&local_b0,(double *)&local_80,&local_b8,
             (string *)&local_c0);
  pcVar5 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_120,"\"\"","reference",(char (*) [1])0x15db90,&local_b0);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2fd,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar5 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_120,"\"\"","prefix",(char (*) [1])0x15db90,&local_80);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2fe,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_120,"1","exponent",1.0,local_b8);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2ff,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_120,"1","multiplier",1.0,local_c0);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x300,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar3 = local_90;
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"daves","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"house","");
  pcVar5 = "";
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"","");
  libcellml::Units::addUnit(psVar3,(string *)&local_120,1.0,1.0,(string *)local_100);
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  libcellml::Units::unitAttributes
            ((ulong)local_90,(string *)0x2,(string *)&local_b0,(double *)&local_80,&local_b8,
             (string *)&local_c0);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_120,"\"daves\"","reference",(char (*) [6])"daves",&local_b0);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x304,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_120,"\"house\"","prefix",(char (*) [6])"house",&local_80);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x305,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar3 = local_90;
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"daves","");
  libcellml::Units::unitAttributes
            (psVar3,(string *)&local_120,(double *)&local_80,&local_b8,(string *)&local_c0);
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_120,"\"daves\"","reference",(char (*) [6])"daves",&local_b0);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x308,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_120,"\"house\"","prefix",(char (*) [6])"house",&local_80);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x309,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"kelvin","");
  libcellml::Units::unitAttributes
            (local_90,(string *)&local_120,(double *)&local_80,&local_b8,(string *)&local_c0);
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  pcVar5 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_120,"\"\"","prefix",(char (*) [1])0x15db90,&local_80);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x30c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_120,"1.0","exponent",1.0,local_b8);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x30d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_120,"1.8","multiplier",1.8,local_c0);
  if (local_120._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_100);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x30e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_100[0] != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100[0] != (long *)0x0)) {
        (**(code **)(*local_100[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

TEST(Units, unitAttributes)
{
    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("fahrenheitish");

    /* Give prefix and exponent their default values. */
    u->addUnit("kelvin", 0, 1.0, 1.8);
    m->addUnits(u);

    std::string reference;
    std::string prefix;
    std::string id;
    double exponent;
    double multiplier;
    u->unitAttributes(0, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("kelvin", reference);
    EXPECT_EQ("", prefix);
    EXPECT_DOUBLE_EQ(1.0, exponent);
    EXPECT_DOUBLE_EQ(1.8, multiplier);

    u->addUnit("NewUnit", 4, 1.05, 17.0);
    u->unitAttributes(1, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("NewUnit", reference);
    EXPECT_EQ("4", prefix);
    EXPECT_DOUBLE_EQ(1.05, exponent);
    EXPECT_DOUBLE_EQ(17, multiplier);

    // Get non-existent unit.
    u->unitAttributes(2, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("", reference);
    EXPECT_EQ("", prefix);
    EXPECT_DOUBLE_EQ(1, exponent);
    EXPECT_DOUBLE_EQ(1, multiplier);

    u->addUnit("daves", "house");
    u->unitAttributes(2, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("daves", reference);
    EXPECT_EQ("house", prefix);

    u->unitAttributes("daves", prefix, exponent, multiplier, id);
    EXPECT_EQ("daves", reference);
    EXPECT_EQ("house", prefix);

    u->unitAttributes("kelvin", prefix, exponent, multiplier, id);
    EXPECT_EQ("", prefix);
    EXPECT_DOUBLE_EQ(1.0, exponent);
    EXPECT_DOUBLE_EQ(1.8, multiplier);
}